

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
     init_instance(instance *inst,void *holder_ptr)

{
  bool bVar1;
  type_info *find_type;
  PyTypeObject **ppPVar2;
  undefined1 local_48 [8];
  value_and_holder v_h;
  
  v_h.vh = &kratos::InterfaceDefinition::typeinfo;
  find_type = pybind11::detail::get_type_info((type_index *)&v_h.vh,false);
  pybind11::detail::instance::get_value_and_holder((value_and_holder *)local_48,inst,find_type,true)
  ;
  bVar1 = pybind11::detail::value_and_holder::instance_registered((value_and_holder *)local_48);
  if (!bVar1) {
    pybind11::detail::register_instance(inst,(v_h.type)->type,(type_info *)v_h.index);
    pybind11::detail::value_and_holder::set_instance_registered((value_and_holder *)local_48,true);
  }
  ppPVar2 = &((v_h.type)->type->ob_base).ob_base.ob_type;
  if ((v_h.type)->type == (PyTypeObject *)0x0) {
    ppPVar2 = (PyTypeObject **)0x0;
  }
  init_holder<kratos::InterfaceDefinition>
            (inst,(value_and_holder *)local_48,(holder_type *)holder_ptr,
             (enable_shared_from_this<kratos::InterfaceDefinition> *)ppPVar2);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }